

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown2Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  int x;
  uint16_t *t;
  uint16_t *s;
  int dst_width_local;
  uint16_t *dst_local;
  ptrdiff_t src_stride_local;
  uint16_t *src_ptr_local;
  
  t = src_ptr + src_stride;
  s = src_ptr;
  dst_local = dst;
  for (x = 0; x < dst_width + -1; x = x + 2) {
    *dst_local = (uint16_t)((int)((uint)*s + (uint)s[1] + (uint)*t + (uint)t[1] + 2) >> 2);
    dst_local[1] = (uint16_t)((int)((uint)s[2] + (uint)s[3] + (uint)t[2] + (uint)t[3] + 2) >> 2);
    dst_local = dst_local + 2;
    s = s + 4;
    t = t + 4;
  }
  if ((dst_width & 1U) != 0) {
    *dst_local = (uint16_t)((int)((uint)*s + (uint)s[1] + (uint)*t + (uint)t[1] + 2) >> 2);
  }
  return;
}

Assistant:

void ScaleRowDown2Box_16_C(const uint16_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint16_t* dst,
                           int dst_width) {
  const uint16_t* s = src_ptr;
  const uint16_t* t = src_ptr + src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
  }
}